

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literal *value)

{
  undefined1 auVar1 [8];
  bool bVar2;
  int32_t x;
  Shareability SVar3;
  Const *pCVar4;
  HeapType HVar5;
  Expression *pEVar6;
  RefFunc *this_00;
  RefI31 *this_01;
  int64_t iVar7;
  StringConst *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined1 reuse;
  undefined1 auVar9 [8];
  Literal *pLVar10;
  char *__assertion;
  long lVar11;
  long lVar12;
  long lVar13;
  string_view sVar14;
  HeapType local_230;
  stringstream wtf16;
  ostream local_220 [112];
  ios_base local_1b0 [264];
  Literal local_a8;
  Literal local_90;
  Literal *local_78;
  Builder *local_70;
  undefined1 local_68 [8];
  value_type c;
  Type local_40;
  Type type;
  
  local_40.id = (value->type).id;
  if (local_40.id - 2 < 5) {
    Literal::Literal(&local_a8,value);
    pCVar4 = makeConst(this,&local_a8);
    pLVar10 = &local_a8;
  }
  else {
    bVar2 = wasm::Type::isNull(&value->type);
    if (bVar2) {
      HVar5 = wasm::Type::getHeapType(&local_40);
      pEVar6 = (Expression *)makeRefNull(this,HVar5);
      return pEVar6;
    }
    bVar2 = wasm::Type::isFunction(&local_40);
    if (bVar2) {
      sVar14 = (string_view)Literal::getFunc(value);
      HVar5 = wasm::Type::getHeapType(&local_40);
      this_00 = (RefFunc *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = RefFuncId
      ;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 0;
      (this_00->func).super_IString.str._M_len = 0;
      (this_00->func).super_IString.str = sVar14;
      RefFunc::finalize(this_00,HVar5);
      return (Expression *)this_00;
    }
    if (((local_40.id & 1) == 0 && 6 < local_40.id) &&
       (HVar5 = wasm::Type::getHeapType(&local_40),
       ((uint)HVar5.id & 0x7b) == 0x30 && HVar5.id < 0x7d)) {
      x = Literal::geti31(value,true);
      pCVar4 = makeConst<int>(this,x);
      local_230 = wasm::Type::getHeapType(&local_40);
      SVar3 = HeapType::getShared(&local_230);
      this_01 = (RefI31 *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression._id = RefI31Id;
      this_01->value = (Expression *)pCVar4;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression.type.id =
           (ulong)(SVar3 == Shared) * 4 + 0x30;
      RefI31::finalize(this_01);
      return (Expression *)this_01;
    }
    bVar2 = wasm::Type::isString(&local_40);
    if (bVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_230);
      Literal::getGCData((Literal *)local_68);
      auVar1 = local_68;
      local_70 = this;
      if (c.field_0.i64 != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   c.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      lVar12 = ((long)(((Literals *)((long)auVar1 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(((Literals *)((long)auVar1 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
               (((Literals *)((long)auVar1 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
      auVar9 = auVar1;
      if (lVar12 != 0) {
        local_78 = (((Literals *)((long)auVar1 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
                   _M_elems;
        lVar13 = -0x18;
        lVar11 = 0;
        do {
          pLVar10 = (Literal *)
                    ((long)&((((Literals *)((long)auVar1 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar13);
          if (lVar11 == 0) {
            pLVar10 = local_78;
          }
          Literal::Literal((Literal *)local_68,pLVar10);
          iVar7 = Literal::getInteger((Literal *)local_68);
          if (0xffff < iVar7) {
            __assert_fail("u < 0x10000",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                          ,0x502,"Expression *wasm::Builder::makeConstantExpression(Literal)");
          }
          type.id._7_1_ = (undefined1)iVar7;
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_220,(char *)((long)&type.id + 7),1);
          type.id._7_1_ = (undefined1)((ulong)iVar7 >> 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_220,(char *)((long)&type.id + 7),1);
          Literal::~Literal((Literal *)local_68);
          lVar11 = lVar11 + 1;
          lVar13 = lVar13 + 0x18;
        } while (lVar12 != lVar11);
      }
      reuse = SUB81(auVar9,0);
      std::__cxx11::stringbuf::str();
      sVar14._M_str = (char *)0x0;
      sVar14._M_len = (size_t)local_68;
      sVar14 = IString::interned((IString *)
                                 c.field_0.gcData.
                                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 ,sVar14,(bool)reuse);
      this_02 = (StringConst *)MixedArena::allocSpace(&local_70->wasm->allocator,0x20,8);
      (this_02->super_SpecificExpression<(wasm::Expression::Id)83>).super_Expression._id =
           StringConstId;
      (this_02->super_SpecificExpression<(wasm::Expression::Id)83>).super_Expression.type.id = 0;
      (this_02->string).super_IString.str._M_len = 0;
      (this_02->string).super_IString.str = sVar14;
      StringConst::finalize(this_02);
      if (local_68 != (undefined1  [8])((long)&c.field_0 + 8)) {
        operator_delete((void *)local_68,(ulong)(c.field_0.func.super_IString.str._M_str + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_230);
      std::ios_base::~ios_base(local_1b0);
      return (Expression *)this_02;
    }
    if ((((local_40.id < 7) || ((local_40.id & 1) != 0)) ||
        (HVar5 = wasm::Type::getHeapType(&local_40), 0x7c < HVar5.id)) ||
       (((uint)HVar5.id & 0x7b) != 8)) {
      if ((local_40.id & 1) == 0 || local_40.id < 7) {
        if (local_40.id < 7) {
          handle_unreachable("unsupported constant expression",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                             ,0x50e);
        }
        __assertion = "type.isBasic() && \"TODO: handle compound types\"";
      }
      else {
        __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                    ,0x50d,"Expression *wasm::Builder::makeConstantExpression(Literal)");
    }
    Literal::internalize(&local_90,value);
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)makeConstantExpression(this,&local_90);
    pCVar4 = (Const *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
    (pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = RefAsId;
    (pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
    (pCVar4->value).field_0.i32 = 2;
    (pCVar4->value).field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var8;
    RefAs::finalize((RefAs *)pCVar4);
    pLVar10 = &local_90;
  }
  Literal::~Literal(pLVar10);
  return (Expression *)pCVar4;
}

Assistant:

Expression* makeConstantExpression(Literal value) {
    auto type = value.type;
    if (type.isNumber()) {
      return makeConst(value);
    }
    if (value.isNull()) {
      return makeRefNull(type.getHeapType());
    }
    if (type.isFunction()) {
      return makeRefFunc(value.getFunc(), type.getHeapType());
    }
    if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::i31)) {
      return makeRefI31(makeConst(value.geti31()),
                        type.getHeapType().getShared());
    }
    if (type.isString()) {
      // The string is already WTF-16, but we need to convert from `Literals` to
      // actual string.
      std::stringstream wtf16;
      for (auto c : value.getGCData()->values) {
        auto u = c.getInteger();
        assert(u < 0x10000);
        wtf16 << uint8_t(u & 0xFF);
        wtf16 << uint8_t(u >> 8);
      }
      // TODO: Use wtf16.view() once we have C++20.
      return makeStringConst(wtf16.str());
    }
    if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::ext)) {
      return makeRefAs(ExternConvertAny,
                       makeConstantExpression(value.internalize()));
    }
    TODO_SINGLE_COMPOUND(type);
    WASM_UNREACHABLE("unsupported constant expression");
  }